

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::GcAwakeTransientWindowBuffers(ImGuiWindow *window)

{
  int *piVar1;
  int iVar2;
  uint *puVar3;
  ImDrawVert *pIVar4;
  uint *__dest;
  ImDrawVert *__dest_00;
  ImDrawList *pIVar5;
  
  window->MemoryCompacted = false;
  pIVar5 = window->DrawList;
  iVar2 = window->MemoryDrawListIdxCapacity;
  if ((pIVar5->IdxBuffer).Capacity < iVar2) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar2 << 2,GImAllocatorUserData);
    puVar3 = (pIVar5->IdxBuffer).Data;
    if (puVar3 != (uint *)0x0) {
      memcpy(__dest,puVar3,(long)(pIVar5->IdxBuffer).Size << 2);
      puVar3 = (pIVar5->IdxBuffer).Data;
      if ((puVar3 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
    }
    (pIVar5->IdxBuffer).Data = __dest;
    (pIVar5->IdxBuffer).Capacity = iVar2;
    pIVar5 = window->DrawList;
  }
  iVar2 = window->MemoryDrawListVtxCapacity;
  if ((pIVar5->VtxBuffer).Capacity < iVar2) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_00 = (ImDrawVert *)(*GImAllocatorAllocFunc)((long)iVar2 * 0x14,GImAllocatorUserData);
    pIVar4 = (pIVar5->VtxBuffer).Data;
    if (pIVar4 != (ImDrawVert *)0x0) {
      memcpy(__dest_00,pIVar4,(long)(pIVar5->VtxBuffer).Size * 0x14);
      pIVar4 = (pIVar5->VtxBuffer).Data;
      if ((pIVar4 != (ImDrawVert *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
    }
    (pIVar5->VtxBuffer).Data = __dest_00;
    (pIVar5->VtxBuffer).Capacity = iVar2;
  }
  window->MemoryDrawListIdxCapacity = 0;
  window->MemoryDrawListVtxCapacity = 0;
  return;
}

Assistant:

void ImGui::GcAwakeTransientWindowBuffers(ImGuiWindow* window)
{
    // We stored capacity of the ImDrawList buffer to reduce growth-caused allocation/copy when awakening.
    // The other buffers tends to amortize much faster.
    window->MemoryCompacted = false;
    window->DrawList->IdxBuffer.reserve(window->MemoryDrawListIdxCapacity);
    window->DrawList->VtxBuffer.reserve(window->MemoryDrawListVtxCapacity);
    window->MemoryDrawListIdxCapacity = window->MemoryDrawListVtxCapacity = 0;
}